

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectTopXors(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int Entry;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *local_68 [3];
  Vec_Int_t *local_50;
  Vec_Int_t *vPart [2];
  
  iVar2 = 0;
  pGVar4 = Gia_ManCo(p,0);
  pVVar5 = Vec_IntAlloc(100);
  iVar1 = p->vCos->nSize;
  if (iVar1 == 1) {
    if (((uint)*(undefined8 *)pGVar4 >> 0x1d & 1) == 0) {
      iVar1 = Gia_ObjId(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      Vec_IntPush(pVVar5,iVar1);
    }
    else {
      Gia_ManCollectTopXors_rec
                (p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),pVVar5);
    }
  }
  else {
    for (; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      pGVar4 = Gia_ManCo(p,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar1 = Gia_ObjFaninId0p(p,pGVar4);
      if (0 < iVar1) {
        iVar1 = Gia_ObjFaninId0p(p,pGVar4);
        Vec_IntPush(pVVar5,iVar1);
      }
      iVar1 = p->vCos->nSize;
    }
  }
  Gia_ManDupDemiterOrderXors(p,pVVar5);
  Vec_IntReverseOrder(pVVar5);
  Gia_ManCleanMark01(p);
  p_00 = Vec_IntAlloc(100);
  vPart[0] = p_00;
  p_01 = Vec_IntAlloc(100);
  local_50 = pVVar5;
  vPart[1] = p_01;
  for (iVar1 = 0; pVVar5 = local_50, iVar1 < local_50->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(local_50,iVar1);
    pGVar4 = Gia_ManObj(p,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjRecognizeExor(pGVar4,local_68,local_68 + 1);
    if (iVar2 == 0) {
      local_68[1] = p->pObjs;
    }
    else {
      pGVar4 = (Gia_Obj_t *)((ulong)local_68[0] & 0xfffffffffffffffe);
      local_68[1] = (Gia_Obj_t *)((ulong)local_68[1] & 0xfffffffffffffffe);
    }
    local_68[0] = pGVar4;
    uVar3 = Gia_ManDecideWhereToAdd(p,vPart,local_68);
    iVar2 = Gia_ObjId(p,local_68[uVar3]);
    Vec_IntPush(p_00,iVar2);
    iVar2 = Gia_ObjId(p,local_68[uVar3 ^ 1]);
    Vec_IntPush(p_01,iVar2);
    iVar2 = Gia_ObjId(p,local_68[uVar3]);
    Gia_ManSetMark0Dfs_rec(p,iVar2);
    iVar2 = Gia_ObjId(p,local_68[uVar3 ^ 1]);
    Gia_ManSetMark1Dfs_rec(p,iVar2);
  }
  Vec_IntFree(pVVar5);
  Gia_ManCleanMark01(p);
  pVVar5 = Vec_IntAlloc(100);
  for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar1);
    Entry = Vec_IntEntry(p_01,iVar1);
    Vec_IntPush(pVVar5,iVar2);
    Vec_IntPush(pVVar5,Entry);
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntReverseOrder(pVVar5);
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManCollectTopXors( Gia_Man_t * p )
{
    int i, iObj, iObj2, fFlip, Count1 = 0;
    Vec_Int_t * vXors, * vPart[2], * vOrder; 
    Gia_Obj_t * pFan[2], * pObj = Gia_ManCo(p, 0);
    vXors = Vec_IntAlloc( 100 );
    if ( Gia_ManCoNum(p) == 1 )
    {
        if ( Gia_ObjFaninC0(pObj) )
            Gia_ManCollectTopXors_rec( p, Gia_ObjFanin0(pObj), vXors );
        else
            Vec_IntPush( vXors, Gia_ObjId(p, Gia_ObjFanin0(pObj)) );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjFaninId0p(p, pObj) > 0 )
                Vec_IntPush( vXors, Gia_ObjFaninId0p(p, pObj) );
    }
    // order by support size
    Gia_ManDupDemiterOrderXors( p, vXors );
    //Vec_IntPrint( vXors );
    Vec_IntReverseOrder( vXors ); // from MSB to LSB
    // divide into groups
    Gia_ManCleanMark01(p);
    vPart[0] = Vec_IntAlloc( 100 );
    vPart[1] = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vXors, p, pObj, i )
    {
        int fCompl = 0;
        if ( !Gia_ObjRecognizeExor(pObj, &pFan[0], &pFan[1]) )
            pFan[0] = pObj, pFan[1] = Gia_ManConst0(p), Count1++;
        else
        {
            fCompl ^= Gia_IsComplement(pFan[0]);
            fCompl ^= Gia_IsComplement(pFan[1]);
            pFan[0] = Gia_Regular(pFan[0]);
            pFan[1] = Gia_Regular(pFan[1]);
        }
        fFlip = Gia_ManDecideWhereToAdd( p, vPart, pFan );
        Vec_IntPush( vPart[0], Gia_ObjId(p, pFan[fFlip]) );
        Vec_IntPush( vPart[1], Gia_ObjId(p, pFan[!fFlip]) );
        Gia_ManSetMark0Dfs_rec( p, Gia_ObjId(p, pFan[fFlip]) );
        Gia_ManSetMark1Dfs_rec( p, Gia_ObjId(p, pFan[!fFlip]) );
    }
    //printf( "Detected %d single-output XOR miters and %d other miters.\n", Vec_IntSize(vXors) - Count1, Count1 );
    Vec_IntFree( vXors );
    Gia_ManCleanMark01(p);
    // create new order
    vOrder = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryTwo( vPart[0], vPart[1], iObj, iObj2, i )
        Vec_IntPushTwo( vOrder, iObj, iObj2 );
    Vec_IntFree( vPart[0] );
    Vec_IntFree( vPart[1] );
    Vec_IntReverseOrder( vOrder ); // from LSB to MSB
    //Vec_IntPrint( vOrder );
    return vOrder;
}